

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O2

Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::CreateVectorOfSortedTables<MyGame::Example::Monster>
          (FlatBufferBuilderImpl<false> *this,Offset<MyGame::Example::Monster> *v,size_t len)

{
  Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_> OVar1;
  TableKeyComparator<MyGame::Example::Monster> local_20;
  
  local_20.buf_ = &this->buf_;
  std::
  stable_sort<flatbuffers::Offset<MyGame::Example::Monster>*,flatbuffers::FlatBufferBuilderImpl<false>::TableKeyComparator<MyGame::Example::Monster>>
            (v,v + len,&local_20);
  OVar1 = CreateVector<MyGame::Example::Monster>(this,v,len);
  return (Offset<flatbuffers::Vector<flatbuffers::Offset<MyGame::Example::Monster>,_unsigned_int>_>)
         OVar1.o;
}

Assistant:

Offset<Vector<Offset<T>>> CreateVectorOfSortedTables(Offset<T> *v,
                                                       size_t len) {
    std::stable_sort(v, v + len, TableKeyComparator<T>(buf_));
    return CreateVector(v, len);
  }